

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdRetag.cpp
# Opt level: O3

int CmdRetag(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  pointer pcVar1;
  pointer pIVar2;
  bool bVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  string *__return_storage_ptr__;
  string *psVar7;
  pointer pIVar8;
  long lVar9;
  Datetime *pDVar10;
  undefined8 *puVar11;
  iterator __end4;
  pointer pIVar12;
  byte bVar13;
  IntervalFilterFirstOf filtering_1;
  IntervalFilterAllWithIds filtering;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  char local_229;
  undefined1 local_228 [40];
  Database *local_200;
  vector<Interval,_std::allocator<Interval>_> local_1f8;
  undefined1 local_1d8 [36];
  uint local_1b4;
  Range *local_1b0;
  Journal *local_1a8;
  Interval *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_180 [8];
  undefined1 local_178 [8];
  undefined1 auStack_170 [48];
  iterator iStack_140;
  iterator local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  time_t tStack_120;
  int local_118;
  bool local_114;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  bVar13 = 0;
  local_200 = database;
  local_180 = (undefined1  [8])auStack_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"verbose","");
  bVar3 = Rules::getBoolean(rules,(string *)local_180,false);
  if (local_180 != (undefined1  [8])auStack_170) {
    operator_delete((void *)local_180,auStack_170._0_8_ + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_90,cli);
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,cli);
  if (local_c0._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar7 = psVar7 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar7,"At least one tag must be specified. See \'timew help retag\'.","");
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(journal);
  flattenDatabase(local_200,rules);
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (Interval *)0x0;
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Interval *)0x0;
  local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8 = journal;
  if (local_90._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_128._0_1_ = false;
    local_128._1_7_ = 0;
    tStack_120 = 0;
    local_138._M_node = (_Base_ptr)0x0;
    uStack_130._0_4_ = 0;
    uStack_130._4_4_ = 0;
    auStack_170._40_8_ = 0;
    iStack_140._M_node = (_Base_ptr)0x0;
    auStack_170._24_8_ = (_Base_ptr)0x0;
    auStack_170._32_8_ = (_Base_ptr)0x0;
    auStack_170._8_8_ = 0;
    auStack_170._16_8_ = (_Base_ptr)0x0;
    local_178 = (undefined1  [8])0x0;
    auStack_170._0_8_ = 0;
    local_180 = (undefined1  [8])&PTR__Range_0019f778;
    Datetime::Datetime((Datetime *)local_178,0);
    Datetime::Datetime((Datetime *)(auStack_170 + 0x28),0);
    local_1d8._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntervalFilterAllInRange,std::allocator<IntervalFilterAllInRange>,Range>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8),
               (IntervalFilterAllInRange **)local_1d8,
               (allocator<IntervalFilterAllInRange> *)&local_229,(Range *)local_180);
    local_198._M_allocated_capacity = local_1d8._0_8_;
    local_198._8_8_ = local_1d8._8_8_;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    IntervalFilterFirstOf::IntervalFilterFirstOf
              ((IntervalFilterFirstOf *)local_228,(shared_ptr<IntervalFilter> *)&local_198);
    if ((Interval *)local_198._8_8_ != (Interval *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
    if ((pointer)local_1d8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    getTracked((vector<Interval,_std::allocator<Interval>_> *)local_180,local_200,rules,
               (IntervalFilter *)local_228);
    if (local_180 == local_178) {
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar7 = psVar7 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar7,"There is no active time tracking.","")
      ;
      __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    bVar4 = Range::is_open((Range *)local_180);
    if (!bVar4) {
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar7 = psVar7 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar7,"At least one ID must be specified. See \'timew help retag\'.","");
      __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::vector<Interval,_std::allocator<Interval>_>::operator=
              (&local_1f8,(vector<Interval,_std::allocator<Interval>_> *)local_180);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_180);
    local_228._0_8_ = &PTR_accepts_0019fa10;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_);
    }
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,&local_90);
    IntervalFilterAllWithIds::IntervalFilterAllWithIds
              ((IntervalFilterAllWithIds *)local_180,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)local_1d8,local_200,rules,
               (IntervalFilter *)local_180);
    local_228._16_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_228._8_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_228._0_8_ =
         local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8._16_8_;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
    local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    local_1d8._16_8_ = (pointer)0x0;
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_228);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)local_1d8);
    pIVar2 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar12 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((long)local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
        local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
      for (p_Var5 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &local_90._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        if (pIVar12 == pIVar2) {
LAB_00146a1c:
          __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"ID \'@{1}\' does not correspond to any tracking.","");
          format<int>(__return_storage_ptr__,1,(string *)local_228,p_Var5[1]._M_color);
          __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                      std::__cxx11::string::~string);
        }
        pIVar8 = pIVar12;
        while (pIVar8->id != p_Var5[1]._M_color) {
          pIVar8 = pIVar8 + 1;
          if (pIVar8 == pIVar2) goto LAB_00146a1c;
        }
      }
    }
    local_180 = (undefined1  [8])&PTR_accepts_0019f980;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               auStack_170);
  }
  local_1a0 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1b0 = (Range *)&PTR__Interval_0019f6e8;
    local_1b4 = (uint)bVar3;
    pIVar12 = local_1f8.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pDVar10 = &(pIVar12->super_Range).start;
      puVar11 = (undefined8 *)local_178;
      for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar11 = *(undefined8 *)pDVar10;
        pDVar10 = (Datetime *)((long)pDVar10 + (ulong)bVar13 * -0x10 + 8);
        puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      }
      local_180 = (undefined1  [8])local_1b0;
      local_114 = pIVar12->synthetic;
      local_118 = pIVar12->id;
      local_110._M_p = (pointer)&local_100;
      pcVar1 = (pIVar12->annotation)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + (pIVar12->annotation)._M_string_length);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_f0,&(pIVar12->_tags)._M_t);
      Interval::clearTags((Interval *)local_180);
      for (p_Var5 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &local_c0._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        Interval::tag((Interval *)local_180,(string *)(p_Var5 + 1));
      }
      Database::modifyInterval(local_200,pIVar12,(Interval *)local_180,SUB41(local_1b4,0));
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Retagged @",10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pIVar12->id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," as ",4);
        local_1d8._0_8_ = local_1d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8," ","");
        joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((string *)local_228,(string *)local_1d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_c0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_228._0_8_,local_228._8_8_);
        local_229 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_229,1);
        if ((Interval *)local_228._0_8_ != (Interval *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
        }
        if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
      }
      local_180 = (undefined1  [8])local_1b0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      pIVar12 = pIVar12 + 1;
    } while (pIVar12 != local_1a0);
  }
  Journal::endTransaction(local_1a8);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  return 0;
}

Assistant:

int CmdRetag (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  std::set <int> ids = cli.getIds ();
  std::set <std::string> tags = cli.getTags ();

  if (tags.empty ())
  {
    throw std::string ("At least one tag must be specified. See 'timew help retag'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  std::vector <Interval> intervals;

  if (ids.empty ())
  {
    IntervalFilterFirstOf filtering {std::make_shared <IntervalFilterAllInRange> (Range {})};
    auto latest = getTracked (database, rules, filtering);

    if (latest.empty ())
    {
      throw std::string ("There is no active time tracking.");
    }
    else if (! latest.at (0).is_open ())
    {
      throw std::string ("At least one ID must be specified. See 'timew help retag'.");
    }

    intervals = latest;
  }
  else
  {
    auto filtering = IntervalFilterAllWithIds (ids);
    intervals = getTracked (database, rules, filtering);

    if (intervals.size () != ids.size ())
    {
      for (auto& id: ids)
      {
        bool found = false;

        for (auto& interval: intervals)
        {
          if (interval.id == id)
          {
            found = true;
            break;
          }
        }
        if (! found)
        {
          throw format ("ID '@{1}' does not correspond to any tracking.", id);
        }
      }
    }
  }

  // Remove old tags and apply new tags to intervals.
  for (const auto& interval : intervals)
  {
    Interval modified {interval};

    modified.clearTags ();

    for (auto& tag : tags)
    {
      modified.tag (tag);
    }

    database.modifyInterval (interval, modified, verbose);

    if (verbose)
    {
      std::cout << "Retagged @" << interval.id << " as " << joinQuotedIfNeeded (" ", tags) << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}